

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O1

char * flecs::_::symbol_helper<EcsName>::symbol(void)

{
  char cVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  
  name_helper<EcsName>::name()::typeName._4_3_ = 0x656d61;
  name_helper<EcsName>::name()::typeName._0_4_ = 0x4e736345;
  name_util::trim_name(name_helper<EcsName>::name()::typeName);
  __s = (*ecs_os_api.strdup_)(name_helper<EcsName>::name()::typeName);
  sVar2 = strlen(__s);
  if ((int)(uint)sVar2 < 1) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    pcVar5 = __s;
    do {
      cVar1 = *pcVar5;
      if (cVar1 == ':') {
        __s[uVar4] = '.';
        pcVar5 = pcVar5 + 1;
      }
      else {
        uVar3 = uVar4;
        if (cVar1 == '\0') break;
        __s[uVar4] = cVar1;
      }
      uVar4 = uVar4 + 1;
      pcVar5 = pcVar5 + 1;
      uVar3 = sVar2;
    } while (((uint)sVar2 & 0x7fffffff) != uVar4);
    uVar3 = uVar3 & 0xffffffff;
  }
  __s[uVar3] = '\0';
  return __s;
}

Assistant:

static const char* name(void) {
      static const size_t size = (sizeof(__PRETTY_FUNCTION__) - FRONT_SIZE - BACK_SIZE) / 2 + 1u;
      static char typeName[size + 6] = {};
      memcpy(typeName, __PRETTY_FUNCTION__ + FRONT_SIZE, size - 1u);
      name_util::trim_name(typeName);
      return typeName;
    }